

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error.cpp
# Opt level: O0

void pbrt::processError(char *errorType,FileLoc *loc,char *message)

{
  bool bVar1;
  int iVar2;
  undefined8 uVar3;
  string *in_RDX;
  long in_RSI;
  char *in_RDI;
  lock_guard<std::mutex> lock;
  string errorString;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff30;
  FILE *__stream;
  string local_b0 [16];
  allocator<char> *in_stack_ffffffffffffff60;
  char *in_stack_ffffffffffffff68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff70;
  char *in_stack_ffffffffffffff78;
  int in_stack_ffffffffffffff84;
  FileLoc *in_stack_ffffffffffffff88;
  LogLevel in_stack_ffffffffffffff94;
  allocator<char> local_59;
  string local_58 [32];
  string local_38 [32];
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
  Red(in_RDX);
  std::__cxx11::string::~string(local_58);
  std::allocator<char>::~allocator(&local_59);
  if (in_RSI != 0) {
    FileLoc::ToString_abi_cxx11_(in_stack_ffffffffffffff88);
    std::operator+(in_RDI,in_stack_ffffffffffffff30);
    std::__cxx11::string::operator+=(local_38,(string *)&stack0xffffffffffffff70);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff70);
    std::__cxx11::string::~string(local_b0);
  }
  std::__cxx11::string::operator+=(local_38,": ");
  std::__cxx11::string::operator+=(local_38,(char *)in_RDX);
  if ((processError(char_const*,pbrt::FileLoc_const*,char_const*)::lastError_abi_cxx11_ == '\0') &&
     (iVar2 = __cxa_guard_acquire(&processError(char_const*,pbrt::FileLoc_const*,char_const*)::
                                   lastError_abi_cxx11_), iVar2 != 0)) {
    std::__cxx11::string::string
              ((string *)
               &processError(char_const*,pbrt::FileLoc_const*,char_const*)::lastError_abi_cxx11_);
    __cxa_atexit(std::__cxx11::string::~string,
                 &processError(char_const*,pbrt::FileLoc_const*,char_const*)::lastError_abi_cxx11_,
                 &__dso_handle);
    __cxa_guard_release(&processError(char_const*,pbrt::FileLoc_const*,char_const*)::
                         lastError_abi_cxx11_);
  }
  std::lock_guard<std::mutex>::lock_guard
            ((lock_guard<std::mutex> *)in_stack_ffffffffffffff30,
             (mutex_type *)in_stack_ffffffffffffff28);
  bVar1 = std::operator!=(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  if (bVar1) {
    __stream = _stderr;
    uVar3 = std::__cxx11::string::c_str();
    fprintf(__stream,"%s\n",uVar3);
    if (LOGGING_LogLevel < 1) {
      Log<std::__cxx11::string&>
                (in_stack_ffffffffffffff94,(char *)in_stack_ffffffffffffff88,
                 in_stack_ffffffffffffff84,in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
    }
    std::__cxx11::string::operator=
              ((string *)
               &processError(char_const*,pbrt::FileLoc_const*,char_const*)::lastError_abi_cxx11_,
               local_38);
  }
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x543518);
  std::__cxx11::string::~string(local_38);
  return;
}

Assistant:

static void processError(const char *errorType, const FileLoc *loc, const char *message) {
    // Build up an entire formatted error string and print it all at once;
    // this way, if multiple threads are printing messages at once, they
    // don't get jumbled up...
    std::string errorString = Red(errorType);

    if (loc)
        errorString += ": " + loc->ToString();

    errorString += ": ";
    errorString += message;

    // Print the error message (but not more than one time).
    static std::string lastError;
    static std::mutex mutex;
    std::lock_guard<std::mutex> lock(mutex);
    if (errorString != lastError) {
        fprintf(stderr, "%s\n", errorString.c_str());
        LOG_VERBOSE("%s", errorString);
        lastError = errorString;
    }
}